

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidierror.cpp
# Opt level: O3

int anon_unknown.dwarf_22332::RtMidiError_ctor(lua_State *L)

{
  Type type;
  char *__s;
  RtMidiError *this;
  size_t sz;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string local_48;
  
  __s = (char *)luaL_checklstring(L,2,local_50);
  type = luaL_optinteger(L,3,2);
  this = (RtMidiError *)lua_newuserdata(L,0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_51);
  RtMidiError::RtMidiError(this,&local_48,type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  lua_getfield(L,0xffffd8f0,"luartmidi.rtmidierror");
  lua_setmetatable(L,0xfffffffe);
  return 1;
}

Assistant:

int RtMidiError_ctor(lua_State *L) {
	std::size_t sz;
	const char *message = luaL_checklstring(L, 2, &sz);
	lua_Integer typ = luaL_optinteger(L, 3, RtMidiError::Type::UNSPECIFIED);

	auto midierror = reinterpret_cast<RtMidiError *>(
	 lua_newuserdata(L, sizeof(RtMidiError)));
	new (midierror) RtMidiError {message, static_cast<RtMidiError::Type>(typ)};
	luaL_getmetatable(L, MT_RTMIDIERROR);
	lua_setmetatable(L, -2);
	return 1;
}